

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void PatternMatch_CStyleParam(KonohaContext *kctx,KonohaStack *sfp)

{
  kNode *node;
  long lVar1;
  int iVar2;
  ksymbol_t keyid;
  kNameSpace *kctx_00;
  long in_RSI;
  KonohaContext *in_RDI;
  kNode *block;
  KTokenSeq param;
  kToken *tk;
  int returnIdx;
  int endIdx;
  int beginIdx;
  kArray *tokenList;
  ksymbol_t name;
  kNode *stmt;
  KTokenSeq *in_stack_ffffffffffffff88;
  kObject_conflict *o;
  undefined4 uVar3;
  kNameSpace *in_stack_ffffffffffffffa8;
  KonohaContext *in_stack_ffffffffffffffb0;
  char *requiredTokenText;
  int local_34;
  
  node = *(kNode **)(in_RSI + 0x10);
  lVar1 = *(long *)(in_RSI + 0x30);
  iVar2 = (int)*(undefined8 *)(in_RSI + 0x48);
  (*(in_RDI->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_CStyleParam",0x477,"tracing..");
  local_34 = -1;
  requiredTokenText = *(char **)(*(long *)(lVar1 + 0x20) + (long)iVar2 * 8);
  if (*(int *)(*(long *)(requiredTokenText + 0x38) + 0x20) == 7) {
    kctx_00 = kNode_GetNameSpace(in_RDI,node);
    o = *(kObject_conflict **)(requiredTokenText + 0x20);
    uVar3 = 1;
    keyid = (int)(*(ulong *)(*(long *)(requiredTokenText + 0x20) + 0x18) >> 3) - 1;
    memset(&stack0xffffffffffffffa8,0,0x18);
    CheckCStyleParam((KonohaContext *)kctx_00,in_stack_ffffffffffffff88);
    ParseNewNode(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(kArray *)CONCAT44(keyid,uVar3)
                 ,(int *)o,(int)((ulong)kctx_00 >> 0x20),(ParseOption)kctx_00,requiredTokenText);
    kNode_AddParsedObject(in_stack_ffffffffffffffb0,(kNode *)in_stack_ffffffffffffffa8,keyid,o);
    local_34 = iVar2 + 1;
  }
  *(long *)(in_RSI + -0x38) = (long)local_34;
  return;
}

Assistant:

static KMETHOD PatternMatch_CStyleParam(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = -1;
	kToken *tk = tokenList->TokenItems[beginIdx];
	if(tk->resolvedSyntaxInfo->keyword == KSymbol_ParenthesisGroup) {
		KTokenSeq param = {kNode_ns(stmt), RangeGroup(tk->GroupTokenList)};
		CheckCStyleParam(kctx, &param);
		kNode *block = ParseNewNode(kctx, param.ns, param.tokenList, &param.beginIdx, param.endIdx, ParseMetaPatternOption, NULL);
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(block));
		returnIdx = beginIdx + 1;
	}
	KReturnUnboxValue(returnIdx);
}